

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O0

EMoveResult __thiscall
sector_t::MoveCeiling
          (sector_t *this,double speed,double dest,int crush,int direction,bool hexencrush)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double move;
  double movedest;
  double lastpos;
  bool flag;
  bool hexencrush_local;
  int direction_local;
  int crush_local;
  double dest_local;
  double speed_local;
  sector_t_conflict *this_local;
  
  dVar2 = secplane_t::fD(&this->ceilingplane);
  if (direction == -1) {
    bVar1 = secplane_t::isSlope(&this->ceilingplane);
    _direction_local = dest;
    if ((((!bVar1) && (bVar1 = secplane_t::isSlope(&this->floorplane), !bVar1)) &&
        (bVar1 = PortalIsLinked(this,0), !bVar1)) &&
       (((i_compatflags2 & 2U) == 0 && (dVar3 = secplane_t::fD(&this->floorplane), dest < -dVar3))))
    {
      _direction_local = secplane_t::fD(&this->floorplane);
      _direction_local = -_direction_local;
    }
    dVar3 = secplane_t::GetChangedHeight(&this->ceilingplane,-speed);
    if (dVar3 <= _direction_local) {
      dVar3 = secplane_t::HeightDiff(&this->ceilingplane,dVar2,_direction_local);
      bVar1 = MoveAttached(this,crush,dVar3,1,true);
      if (!bVar1) {
        return crushed;
      }
      secplane_t::setD(&this->ceilingplane,_direction_local);
      bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,dVar3,1,false);
      if (bVar1) {
        secplane_t::setD(&this->ceilingplane,dVar2);
        P_ChangeSector((sector_t_conflict *)this,crush,-dVar3,1,true);
        MoveAttached(this,crush,-dVar3,1,false);
      }
      else {
        ChangePlaneTexZ(this,1,dVar3);
      }
      return pastdest;
    }
    bVar1 = MoveAttached(this,crush,-speed,1,true);
    if (!bVar1) {
      return crushed;
    }
    secplane_t::setD(&this->ceilingplane,dVar3);
    bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,-speed,1,false);
    if (bVar1) {
      if ((-1 < crush) && (!hexencrush)) {
        dVar2 = secplane_t::HeightDiff(&this->ceilingplane,dVar2);
        ChangePlaneTexZ(this,1,dVar2);
        return crushed;
      }
      secplane_t::setD(&this->ceilingplane,dVar2);
      P_ChangeSector((sector_t_conflict *)this,crush,speed,1,true);
      MoveAttached(this,crush,speed,1,false);
      return crushed;
    }
    dVar2 = secplane_t::HeightDiff(&this->ceilingplane,dVar2);
    ChangePlaneTexZ(this,1,dVar2);
  }
  else if (direction == 1) {
    dVar3 = secplane_t::GetChangedHeight(&this->ceilingplane,speed);
    if (dest <= dVar3) {
      dVar3 = secplane_t::HeightDiff(&this->ceilingplane,dVar2,dest);
      bVar1 = MoveAttached(this,crush,dVar3,1,true);
      if (!bVar1) {
        return crushed;
      }
      secplane_t::setD(&this->ceilingplane,dest);
      bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,dVar3,1,false);
      if (bVar1) {
        secplane_t::setD(&this->ceilingplane,dVar2);
        P_ChangeSector((sector_t_conflict *)this,crush,dVar3,1,true);
        MoveAttached(this,crush,dVar3,1,false);
      }
      else {
        ChangePlaneTexZ(this,1,dVar3);
      }
      return pastdest;
    }
    bVar1 = MoveAttached(this,crush,speed,1,true);
    if (!bVar1) {
      return crushed;
    }
    secplane_t::setD(&this->ceilingplane,dVar3);
    bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,speed,1,false);
    if (bVar1) {
      secplane_t::setD(&this->ceilingplane,dVar2);
      P_ChangeSector((sector_t_conflict *)this,crush,-speed,1,true);
      MoveAttached(this,crush,-speed,1,false);
      return crushed;
    }
    dVar2 = secplane_t::HeightDiff(&this->ceilingplane,dVar2);
    ChangePlaneTexZ(this,1,dVar2);
  }
  return ok;
}

Assistant:

EMoveResult sector_t::MoveCeiling(double speed, double dest, int crush, int direction, bool hexencrush)
{
	bool	 	flag;
	double 	lastpos;
	double		movedest;
	double		move;
	//double		destheight;	//jff 02/04/98 used to keep floors/ceilings
	// from moving thru each other

	lastpos = ceilingplane.fD();
	switch (direction)
	{
	case -1:
		// DOWN
		// jff 02/04/98 keep ceiling from moving thru floors
		// [RH] not so easy with arbitrary planes
		//destheight = (dest > floorheight) ? dest : floorheight;
		if (!ceilingplane.isSlope() && !floorplane.isSlope() &&
			!PortalIsLinked(sector_t::floor) &&
			(!(i_compatflags2 & COMPATF2_FLOORMOVE) && dest < -floorplane.fD()))
		{
			dest = -floorplane.fD();
		}
		movedest = ceilingplane.GetChangedHeight (-speed);
		if (movedest <= dest)
		{
			move = ceilingplane.HeightDiff (lastpos, dest);

			if (!MoveAttached(crush, move, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(dest);
			flag = P_ChangeSector (this, crush, move, 1, false);

			if (flag)
			{
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, -move, 1, true);
				MoveAttached(crush, -move, 1, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::ceiling, move);
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, -speed, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(movedest);

			// COULD GET CRUSHED
			flag = P_ChangeSector (this, crush, -speed, 1, false);
			if (flag)
			{
				if (crush >= 0 && !hexencrush)
				{
					ChangePlaneTexZ(sector_t::ceiling, ceilingplane.HeightDiff (lastpos));
					return EMoveResult::crushed;
				}
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, speed, 1, true);
				MoveAttached(crush, speed, 1, false);
				return EMoveResult::crushed;
			}
			ChangePlaneTexZ(sector_t::ceiling, ceilingplane.HeightDiff (lastpos));
		}
		break;
												
	case 1:
		// UP
		movedest = ceilingplane.GetChangedHeight (speed);
		if (movedest >= dest)
		{
			move = ceilingplane.HeightDiff (lastpos, dest);

			if (!MoveAttached(crush, move, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(dest);

			flag = P_ChangeSector (this, crush, move, 1, false);
			if (flag)
			{
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, move, 1, true);
				MoveAttached(crush, move, 1, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::ceiling, move);
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, speed, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(movedest);

			flag = P_ChangeSector (this, crush, speed, 1, false);
			if (flag)
			{
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, -speed, 1, true);
				MoveAttached(crush, -speed, 1, false);
				return EMoveResult::crushed;
			}
			ChangePlaneTexZ(sector_t::ceiling, ceilingplane.HeightDiff (lastpos));
		}
		break;
	}
	return EMoveResult::ok;
}